

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceLocation.h
# Opt level: O2

void __thiscall flow::SourceLocation::~SourceLocation(SourceLocation *this)

{
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

SourceLocation() : filename(), begin(), end() {}